

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assignment.cpp
# Opt level: O1

array<double,_5UL> * testFilter(array<double,_5UL> *__return_storage_ptr__,FilterType *filter)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  DirectFormII *pDVar6;
  long lVar7;
  size_t i;
  long lVar8;
  double dVar9;
  double dVar10;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test response: [",0x10);
  bVar5 = true;
  lVar8 = 0;
  do {
    if (!bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
    }
    dVar9 = 1.0;
    lVar7 = 0;
    pDVar6 = (filter->super_PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8>).
             super_CascadeStages<4,_Iir::DirectFormII>.m_states;
    do {
      dVar1 = pDVar6->m_v1;
      dVar2 = pDVar6->m_v2;
      dVar10 = (dVar9 - *(double *)
                         ((long)&(filter->
                                 super_PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8>
                                 ).super_CascadeStages<4,_Iir::DirectFormII>.m_stages[0].m_a1 +
                         lVar7) * dVar1) -
               *(double *)
                ((long)&(filter->
                        super_PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8>).
                        super_CascadeStages<4,_Iir::DirectFormII>.m_stages[0].m_a2 + lVar7) * dVar2;
      dVar9 = *(double *)
               ((long)&(filter->
                       super_PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8>).
                       super_CascadeStages<4,_Iir::DirectFormII>.m_stages[0].m_b1 + lVar7);
      dVar3 = *(double *)
               ((long)&(filter->
                       super_PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8>).
                       super_CascadeStages<4,_Iir::DirectFormII>.m_stages[0].m_b0 + lVar7);
      dVar4 = *(double *)
               ((long)&(filter->
                       super_PoleFilter<Iir::Butterworth::HighPassBase,_Iir::DirectFormII,_8,_8>).
                       super_CascadeStages<4,_Iir::DirectFormII>.m_stages[0].m_b2 + lVar7);
      pDVar6->m_v2 = dVar1;
      pDVar6->m_v1 = dVar10;
      dVar9 = dVar2 * dVar4 + dVar3 * dVar10 + dVar9 * dVar1;
      lVar7 = lVar7 + 0x30;
      pDVar6 = pDVar6 + 1;
    } while (lVar7 != 0xc0);
    __return_storage_ptr__->_M_elems[lVar8] = dVar9;
    std::ostream::_M_insert<double>(dVar9);
    lVar8 = lVar8 + 1;
    bVar5 = false;
  } while (lVar8 != 5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"]\n",2);
  return __return_storage_ptr__;
}

Assistant:

std::array<double, test_len> testFilter(FilterType& filter) {
    std::array <double, test_len> result;
    std::cout << "Test response: [";
    bool first {true};
    for (size_t i = 0; i < test_len; ++i) {
        if (!first) std::cout << ", ";
        first = false;
        result[i] = filter.filter(1.0);
        std::cout << result[i];
    }
    std::cout << "]\n";
    return result;
}